

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O0

handle_t __thiscall sc_core::sc_plist_base::push_front(sc_plist_base *this,void *d)

{
  sc_plist_elem *this_00;
  void *in_RSI;
  long *in_RDI;
  handle_t q;
  
  this_00 = (sc_plist_elem *)sc_plist_elem::operator_new(0x2ed4b1);
  sc_plist_elem::sc_plist_elem(this_00,in_RSI,(sc_plist_elem *)0x0,(sc_plist_elem *)*in_RDI);
  if (*in_RDI == 0) {
    in_RDI[1] = (long)this_00;
    *in_RDI = (long)this_00;
  }
  else {
    *(sc_plist_elem **)(*in_RDI + 8) = this_00;
    *in_RDI = (long)this_00;
  }
  return this_00;
}

Assistant:

sc_plist_base::handle_t
sc_plist_base::push_front( void* d )
{
    handle_t q = new sc_plist_elem( d, (sc_plist_elem*) 0, head );
    if (head) {
        head->prev = q;
        head = q;
    }
    else {
        head = tail = q;
    }
    return q;
}